

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::commitTexturePage
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *puVar1;
  char cVar2;
  GLenum err;
  ostream *poVar3;
  TestError *this_00;
  GLint depth;
  GLint local_3c;
  GLint height;
  GLint width;
  
  puVar1 = &(this->super_SparseTextureClampLookupResidencyTestCase).
            super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.field_0x88;
  local_3c = format;
  poVar3 = std::operator<<((ostream *)puVar1,"Commit Region [level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  if ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.levels +
      -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
               ,0x3de);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  cVar2 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                 super_SparseTexture2LookupTestCase.
                                 super_SparseTexture2CommitmentTestCase.
                                 super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase
                                 .super_TestNode + 0x68))(this,target,level);
  if ((cVar2 != '\0') &&
     (cVar2 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                     super_SparseTexture2LookupTestCase.
                                     super_SparseTexture2CommitmentTestCase.
                                     super_SparseTextureCommitmentTestCase.super_TestCase.
                                     super_TestCase.super_TestNode + 0x70))(this,target,level),
     cVar2 != '\0')) {
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
    if (target == 0x8513) {
      depth = depth * 6;
    }
    gl4cts::Texture::Bind(gl,*texture,target);
    (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                           super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase
                           .super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                           super_TestNode + 0x28))
              (this,gl,target,local_3c,texture,level,0,0,0,width,height,depth,1);
    err = (*gl->getError)();
    glu::checkError(err,"texPageCommitment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x3f1);
    return true;
  }
  poVar3 = std::operator<<((ostream *)puVar1,"Skip commitment [level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  return false;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::commitTexturePage(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Commit Region [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	// Avoid not allowed commitments
	if (!isInPageSizesRange(target, level) || !isPageSizesMultiplication(target, level))
	{
		mLog << "Skip commitment [level: " << level << "] - ";
		return false;
	}

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	Texture::Bind(gl, texture, target);
	texPageCommitment(gl, target, format, texture, level, 0, 0, 0, width, height, depth, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texPageCommitment");

	return true;
}